

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool DynamicProfileStorage::ExportFile(char16 *filename)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t **ppcVar4;
  char *t;
  byte local_aa;
  DWORD local_64;
  bool failed;
  char *pcStack_60;
  DWORD recordSize;
  char *record;
  StorageInfo *info;
  char16 *url;
  uint i;
  DWORD recordCount;
  undefined1 local_30 [8];
  DynamicProfileStorageReaderWriter writer;
  char16 *filename_local;
  
  writer._16_8_ = filename;
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x259,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((((useCacheDir & 1U) == 0) || (bVar2 = AcquireLock(), !bVar2)) ||
     (bVar2 = LoadCacheCatalog(), bVar2)) {
    DynamicProfileStorageReaderWriter::DynamicProfileStorageReaderWriter
              ((DynamicProfileStorageReaderWriter *)local_30);
    bVar2 = DynamicProfileStorageReaderWriter::Init
                      ((DynamicProfileStorageReaderWriter *)local_30,(char16 *)writer._16_8_,L"wcb",
                       true,(errno_t *)0x0);
    if (bVar2) {
      url._4_4_ = JsUtil::
                  BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                  ::Count(&infoMap);
      bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                        ((DynamicProfileStorageReaderWriter *)local_30,&MagicNumber);
      if (((bVar2) &&
          (bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                             ((DynamicProfileStorageReaderWriter *)local_30,&FileFormatVersion),
          bVar2)) &&
         (bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)local_30,(uint *)((long)&url + 4))
         , bVar2)) {
        for (url._0_4_ = 0; (uint)url < url._4_4_; url._0_4_ = (uint)url + 1) {
          ppcVar4 = JsUtil::
                    BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                    ::GetKeyAt(&infoMap,(uint)url);
          info = (StorageInfo *)*ppcVar4;
          if (info == (StorageInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x27a,"(false)","false");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
          else {
            record = &JsUtil::
                      BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                      ::GetValueAt(&infoMap,(uint)url)->isFileStorage;
            if ((((StorageInfo *)record)->isFileStorage & 1U) == 0) {
              if ((useCacheDir & 1U) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar3 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x28e,"(!useCacheDir)","!useCacheDir");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar3 = 0;
              }
              if ((locked & 1U) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar3 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x28f,"(!locked)","!locked");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar3 = 0;
              }
              pcStack_60 = *(char **)(record + 8);
            }
            else {
              if ((useCacheDir & 1U) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar3 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x283,"(useCacheDir)","useCacheDir");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar3 = 0;
              }
              pcStack_60 = StorageInfo::ReadRecord((StorageInfo *)record);
              if (pcStack_60 == (char *)0x0) {
                ReleaseLock();
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar3 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x288,"(0)","0");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar3 = 0;
                filename_local._7_1_ = false;
                goto LAB_00dbabcf;
              }
            }
            local_64 = GetRecordSize(pcStack_60);
            bVar2 = DynamicProfileStorageReaderWriter::WriteUtf8String
                              ((DynamicProfileStorageReaderWriter *)local_30,(char16 *)info);
            local_aa = 1;
            if (bVar2) {
              bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                                ((DynamicProfileStorageReaderWriter *)local_30,&local_64);
              local_aa = 1;
              if (bVar2) {
                t = GetRecordBuffer(pcStack_60);
                bVar2 = DynamicProfileStorageReaderWriter::WriteArray<char_const>
                                  ((DynamicProfileStorageReaderWriter *)local_30,t,(ulong)local_64);
                local_aa = bVar2 ^ 0xff;
              }
            }
            if ((useCacheDir & 1U) != 0) {
              DeleteRecord(pcStack_60);
            }
            if ((local_aa & 1) != 0) {
              if ((useCacheDir & 1U) != 0) {
                ReleaseLock();
              }
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x2a2,"(0)","0");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 0;
              filename_local._7_1_ = false;
              goto LAB_00dbabcf;
            }
          }
        }
        DynamicProfileStorageReaderWriter::Close
                  ((DynamicProfileStorageReaderWriter *)local_30,false);
        bVar2 = DoTrace();
        if (bVar2) {
          Output::Print(L"TRACE: DynamicProfileStorage: Exported file: \'%s\'\n",writer._16_8_);
          Output::Flush();
        }
        filename_local._7_1_ = true;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                           ,0x272,"(0)","0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
        filename_local._7_1_ = false;
      }
    }
    else {
      Output::Print(L"ERROR: DynamicProfileStorage: Unable to open file \'%s\' to export\n",
                    writer._16_8_);
      Output::Flush();
      filename_local._7_1_ = false;
    }
LAB_00dbabcf:
    i = 1;
    DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
              ((DynamicProfileStorageReaderWriter *)local_30);
  }
  else {
    ReleaseLock();
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x260,"(0)","0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    filename_local._7_1_ = false;
  }
  return filename_local._7_1_;
}

Assistant:

bool DynamicProfileStorage::ExportFile(__in_z char16 const * filename)
{
    AssertOrFailFast(enabled);

    if (useCacheDir && AcquireLock())
    {
        if (!LoadCacheCatalog()) // refresh the cache catalog
        {
            ReleaseLock();
            AssertOrFailFast(FALSE);
            return false;
        }
    }

    DynamicProfileStorageReaderWriter writer;

    if (!writer.Init(filename, _u("wcb"), true))
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Unable to open file '%s' to export\n"), filename);
        Output::Flush();
        return false;
    }
    DWORD recordCount = infoMap.Count();
    if (!writer.Write(MagicNumber)
        || !writer.Write(FileFormatVersion)
        || !writer.Write(recordCount))
    {
        AssertOrFailFast(FALSE);
        return false;
    }
    for (uint i = 0; i < recordCount; i++)
    {
        char16 const * url = infoMap.GetKeyAt(i);
        if (url == nullptr)
        {
            AssertOrFailFast(false);
            continue;
        }

        StorageInfo const& info = infoMap.GetValueAt(i);

        char const * record;
        if (info.isFileStorage)
        {
            AssertOrFailFast(useCacheDir);
            record = info.ReadRecord();
            if (record == nullptr)
            {
                ReleaseLock();
                AssertOrFailFast(FALSE);
                return false;
            }
        }
        else
        {
            AssertOrFailFast(!useCacheDir);
            AssertOrFailFast(!locked);
            record = info.record;
        }
        DWORD recordSize = GetRecordSize(record);

        bool failed = (!writer.WriteUtf8String(url)
            || !writer.Write(recordSize)
            || !writer.WriteArray(GetRecordBuffer(record), recordSize));

        if (useCacheDir)
        {
            DeleteRecord(record);
        }
        if (failed)
        {
            if (useCacheDir)
            {
                ReleaseLock();
            }
            AssertOrFailFast(FALSE);
            return false;
        }
    }
    writer.Close();
#if DBG_DUMP
    if (DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Exported file: '%s'\n"), filename);
        Output::Flush();
    }
#endif
    return true;
}